

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TreeNodeExV(void *ptr_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiWindow *this;
  char *in_RCX;
  char *label_end;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *in_stack_00000108;
  char *in_stack_00000110;
  ImGuiTreeNodeFlags in_stack_0000011c;
  ImGuiID in_stack_00000120;
  __va_list_tag *in_stack_ffffffffffffffc0;
  ImGuiContext *ptr;
  bool local_1;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    ptr = GImGui;
    ImFormatStringV(in_RCX,(size_t)this,&GImGui->Initialized,in_stack_ffffffffffffffc0);
    ImGuiWindow::GetID(this,ptr);
    local_1 = TreeNodeBehavior(in_stack_00000120,in_stack_0000011c,in_stack_00000110,
                               in_stack_00000108);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::TreeNodeExV(const void* ptr_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const char* label_end = g.TempBuffer + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    return TreeNodeBehavior(window->GetID(ptr_id), flags, g.TempBuffer, label_end);
}